

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O1

void __thiscall
Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
          (DenseStorage<double,__1,__1,_1,_0> *this,DenseIndex size,DenseIndex nbRows,
          DenseIndex param_3)

{
  double *pdVar1;
  undefined8 *puVar2;
  
  if (size != 0) {
    if ((ulong)size >> 0x3d == 0) {
      pdVar1 = (double *)malloc(size << 3);
      if (pdVar1 != (double *)0x0) goto LAB_00105261;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = operator_delete;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pdVar1 = (double *)0x0;
LAB_00105261:
  this->m_data = pdVar1;
  this->m_rows = nbRows;
  return;
}

Assistant:

DenseStorage(DenseIndex size, DenseIndex nbRows, DenseIndex) : m_data(internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size)), m_rows(nbRows)
    { EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN }